

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileByName(DescriptorPool *this,string *name)

{
  undefined1 uVar1;
  DescriptorPool *in_RSI;
  long in_RDI;
  FileDescriptor *result;
  MutexLockMaybe lock;
  string *in_stack_000000c0;
  DescriptorPool *in_stack_000000c8;
  Mutex *in_stack_ffffffffffffff98;
  FileDescriptor *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  Tables *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  internal::MutexLockMaybe::MutexLockMaybe
            ((MutexLockMaybe *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (*(long *)(in_RDI + 8) != 0) {
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4adfcf);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4adfdb);
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4adfe9);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4adff5);
  }
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4ae003);
  local_8 = Tables::FindFile(in_stack_ffffffffffffffb0,
                             (string *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
                            );
  if (local_8 == (FileDescriptor *)0x0) {
    if (*(long *)(in_RDI + 0x18) != 0) {
      local_8 = FindFileByName(in_RSI,in_stack_ffffffffffffffe0);
      if (local_8 != (FileDescriptor *)0x0) goto LAB_004ae125;
      in_stack_ffffffffffffffb0 = (Tables *)0x0;
    }
    uVar1 = TryFindFileInFallbackDatabase(in_stack_000000c8,in_stack_000000c0);
    if ((bool)uVar1) {
      std::
      unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
      ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    *)0x4ae0d8);
      in_stack_ffffffffffffffa0 =
           Tables::FindFile(in_stack_ffffffffffffffb0,
                            (string *)CONCAT17(uVar1,in_stack_ffffffffffffffa8));
      local_8 = in_stack_ffffffffffffffa0;
      if (in_stack_ffffffffffffffa0 != (FileDescriptor *)0x0) goto LAB_004ae125;
    }
    local_8 = (FileDescriptor *)0x0;
  }
LAB_004ae125:
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)in_stack_ffffffffffffffa0);
  return local_8;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileByName(
    const std::string& name) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  const FileDescriptor* result = tables_->FindFile(name);
  if (result != nullptr) return result;
  if (underlay_ != nullptr) {
    result = underlay_->FindFileByName(name);
    if (result != nullptr) return result;
  }
  if (TryFindFileInFallbackDatabase(name)) {
    result = tables_->FindFile(name);
    if (result != nullptr) return result;
  }
  return nullptr;
}